

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

int cmOutputConverter::Shell__ArgumentNeedsQuotes(char *in,int isUnix,int flags)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char *c;
  int iVar4;
  
  bVar1 = *in;
  iVar4 = 1;
  if (bVar1 != 0) {
    cVar2 = *in;
    c = in;
    while ((cVar2 != '\0' &&
           (((flags & 0x40U) == 0 || (c = Shell__SkipMakeVariables(c), *c != '\0'))))) {
      iVar3 = Shell__CharNeedsQuotes(*c,isUnix,flags);
      if (iVar3 != 0) {
        return 1;
      }
      cVar2 = c[1];
      c = c + 1;
    }
    if (((isUnix != 0) || (in[1] != '\0')) ||
       (((0x3b < bVar1 - 0x23 || ((0x800000010000009U >> ((ulong)(bVar1 - 0x23) & 0x3f) & 1) == 0))
        && (bVar1 != 0x7c)))) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int cmOutputConverter::Shell__ArgumentNeedsQuotes(const char* in,
                                                  int isUnix, int flags)
{
  /* The empty string needs quotes.  */
  if(!*in)
    {
    return 1;
    }

  /* Scan the string for characters that require quoting.  */
  {
  const char* c;
  for(c=in; *c; ++c)
    {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if(flags & Shell_Flag_AllowMakeVariables)
      {
#if KWSYS_SYSTEM_SHELL_QUOTE_MAKE_VARIABLES
      const char* skip = Shell__SkipMakeVariables(c);
      if(skip != c)
        {
        /* We need to quote make variable references to preserve the
           string with contents substituted in its place.  */
        return 1;
        }
#else
      /* Skip over the make variable references if any are present.  */
      c = Shell__SkipMakeVariables(c);

      /* Stop if we have reached the end of the string.  */
      if(!*c)
        {
        break;
        }
#endif
      }

    /* Check whether this character needs quotes.  */
    if(Shell__CharNeedsQuotes(*c, isUnix, flags))
      {
      return 1;
      }
    }
  }

  /* On Windows some single character arguments need quotes.  */
  if(!isUnix && *in && !*(in+1))
    {
    char c = *in;
    if((c == '?') || (c == '&') || (c == '^') || (c == '|') || (c == '#'))
      {
      return 1;
      }
    }

  return 0;
}